

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

void __thiscall net_uv::Server::~Server(Server *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  (this->super_Runnable)._vptr_Runnable = (_func_int **)&PTR__Server_0016ca30;
  (this->super_SessionManager)._vptr_SessionManager = (_func_int **)&DAT_0016cab0;
  pcVar2 = (this->m_ip)._M_dataplus._M_p;
  paVar1 = &(this->m_ip).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->m_disconnectCall).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_disconnectCall,(_Any_data *)&this->m_disconnectCall,
              __destroy_functor);
  }
  p_Var3 = (this->m_recvCall).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_recvCall,(_Any_data *)&this->m_recvCall,__destroy_functor);
  }
  p_Var3 = (this->m_newConnectCall).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_newConnectCall,(_Any_data *)&this->m_newConnectCall,
              __destroy_functor);
  }
  p_Var3 = (this->m_closeCall).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_closeCall,(_Any_data *)&this->m_closeCall,__destroy_functor);
  }
  SessionManager::~SessionManager(&this->super_SessionManager);
  Runnable::~Runnable(&this->super_Runnable);
  return;
}

Assistant:

Server::~Server()
{}